

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addAtom(Molecule *this,Atom *atom)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_RDI;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,OpenMD::Atom*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)__last._M_current,
               __val._M_current);
  }
  return;
}

Assistant:

void Molecule::addAtom(Atom* atom) {
    if (std::find(atoms_.begin(), atoms_.end(), atom) == atoms_.end()) {
      atoms_.push_back(atom);
    }
  }